

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

void __thiscall
embree::SceneGraph::QuadMeshNode::QuadMeshNode
          (QuadMeshNode *this,Ref<embree::SceneGraph::QuadMeshNode> *imesh,Transformations *spaces)

{
  MaterialNode *pMVar1;
  
  Node::Node(&this->super_Node,true);
  (this->super_Node).super_RefCount._vptr_RefCount = (_func_int **)&PTR__QuadMeshNode_002a7930;
  this->time_range = imesh->ptr->time_range;
  transformMSMBlurVec3faBuffer(&this->positions,&imesh->ptr->positions,spaces);
  transformMSMBlurNormalBuffer<embree::Vec3fa>(&this->normals,&imesh->ptr->normals,spaces);
  std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::vector
            (&this->texcoords,&imesh->ptr->texcoords);
  std::
  vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
  ::vector(&this->quads,&imesh->ptr->quads);
  pMVar1 = (imesh->ptr->material).ptr;
  (this->material).ptr = pMVar1;
  if (pMVar1 != (MaterialNode *)0x0) {
    (*(pMVar1->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  return;
}

Assistant:

QuadMeshNode (Ref<SceneGraph::QuadMeshNode> imesh, const Transformations& spaces)
        : Node(true),
          time_range(imesh->time_range),
          positions(transformMSMBlurVec3faBuffer(imesh->positions,spaces)),
          normals(transformMSMBlurNormalBuffer(imesh->normals,spaces)),
          texcoords(imesh->texcoords), quads(imesh->quads), material(imesh->material) {}